

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O1

void osgen_disp_trunc(osgen_win_t *win,int y,int x,int oss_color,char *p)

{
  ulong uVar1;
  size_t __n;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  char buf [64];
  char local_78 [72];
  
  if ((S_deferred_redraw == '\0') && ((win->flags & 4) == 0)) {
    uVar1 = strlen(p);
    uVar2 = 0;
    if (0 < x) {
      uVar2 = (ulong)(uint)x;
    }
    if (x < (int)win->wid && (0 < (int)uVar1 + x && y < (int)win->ht)) {
      if (x < 0) {
        uVar3 = (ulong)(uint)-x;
        bVar4 = uVar1 < uVar3;
        uVar1 = uVar1 - uVar3;
        if (bVar4 || uVar1 == 0) {
          return;
        }
        p = p + uVar3;
        x = 0;
      }
      uVar2 = win->wid - uVar2;
      if (uVar1 < uVar2) {
        ossdsp(y + win->winy,x + win->winx,oss_color,p);
        return;
      }
      for (; uVar2 != 0; uVar2 = uVar2 - __n) {
        __n = 0x3f;
        if (uVar2 < 0x3f) {
          __n = uVar2;
        }
        memcpy(local_78,p,__n);
        local_78[__n] = '\0';
        ossdsp(win->winy + y,win->winx + x,oss_color,local_78);
        x = x + (int)__n;
        p = p + __n;
      }
    }
  }
  return;
}

Assistant:

static void osgen_disp_trunc(osgen_win_t *win, int y, int x, int oss_color,
                             const char *p)
{
    char buf[64];
    size_t chars_rem;
    size_t wid_rem;

    /* if we have deferred redrawing pending, don't bother drawing now */
    if (S_deferred_redraw || (win->flags & OSGEN_DEFER_REDRAW) != 0)
        return;

    /* get the number of characters to be displayed */
    chars_rem = strlen(p);

    /* calculate the amount of space we have to work with on the screen */
    wid_rem = win->wid - (x >= 0 ? x : 0);

    /* make sure at least some of the text overlaps the window */
    if (y < 0 || y >= (int)win->ht
        || x + (int)chars_rem <= 0 || x >= (int)win->wid)
        return;

    /* 
     *   if we're starting to the left of the window, skip characters up to
     *   the first character visible in the window 
     */
    if (x < 0)
    {
        /* 
         *   get the number of characters to skip - this is simply the
         *   negative of the x position, since x position zero is the first
         *   column to display 
         */
        x = -x;

        /* 
         *   if we don't have enough characters to reach the left edge of
         *   the window, we have nothing to do 
         */
        if (chars_rem <= (size_t)x)
            return;

        /* skip the desired number of characters */
        chars_rem -= x;
        p += x;

        /* we've skipped up to column zero, so proceed from there */
        x = 0;
    }

    /* if the text entirely fits, display it and we're done */
    if (chars_rem < wid_rem)
    {
        /* display the entire string */
        ossdsp(win->winy + y, win->winx + x, oss_color, p);

        /* done */
        return;
    }

    /* 
     *   we have too much to display, so display as much as will fit - keep
     *   going until we run out of space for the display (we know we'll run
     *   out of space before we run out of text, because we know we have too
     *   much text to fit) 
     */
    while (wid_rem != 0)
    {
        size_t cur;

        /* display as much as will fit, up to our buffer length */
        cur = wid_rem;
        if (cur > sizeof(buf) - 1)
            cur = sizeof(buf) - 1;

        /* copy this portion to our buffer and null-terminate it */
        memcpy(buf, p, cur);
        buf[cur] = '\0';

        /* display it */
        ossdsp(win->winy + y, win->winx + x, oss_color, buf);

        /* advance our screen position */
        x += cur;

        /* advance past the source material we just displayed */
        p += cur;

        /* deduct the on-screen space we consumed from the remaining space */
        wid_rem -= cur;
    }
}